

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdi::ControlContainer::showButtonsInMenuBar(ControlContainer *this,QMenuBar *menuBar)

{
  QPointer<QWidget> *this_00;
  bool bVar1;
  QWidget *pQVar2;
  ControllerWidget *pCVar3;
  Data *pDVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  QObject *object;
  
  if (menuBar == (QMenuBar *)0x0) {
    return;
  }
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->mdiChild);
  if (!bVar1) {
    return;
  }
  if ((*(byte *)(*(long *)((this->mdiChild).wp.value + 0x20) + 0xd) & 8) != 0) {
    return;
  }
  QWeakPointer<QObject>::assign<QObject>(&(this->m_menuBar).wp,(QObject *)menuBar);
  this_00 = &this->m_menuLabel;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if ((bVar1) && ((*(byte *)(*(long *)((this->mdiChild).wp.value + 0x20) + 0xd) & 0x20) != 0)) {
    pQVar2 = QMenuBar::cornerWidget(menuBar,TopLeftCorner);
    if (pQVar2 == (QWidget *)0x0) {
      pDVar4 = (this_00->wp).d;
LAB_0041637d:
      pQVar6 = (QWidget *)(this->m_menuLabel).wp.value;
      pQVar5 = (QWidget *)0x0;
      if (*(int *)(pDVar4 + 4) != 0) {
        pQVar5 = pQVar6;
      }
      if (pQVar5 != pQVar2) {
        if (*(int *)(pDVar4 + 4) == 0) {
          pQVar6 = (QWidget *)0x0;
        }
        goto LAB_0041639c;
      }
    }
    else {
      QWidget::hide(pQVar2);
      pDVar4 = (this_00->wp).d;
      if (pDVar4 != (Data *)0x0) goto LAB_0041637d;
      pQVar6 = (QWidget *)0x0;
LAB_0041639c:
      QMenuBar::setCornerWidget(menuBar,pQVar6,TopLeftCorner);
      QWeakPointer<QObject>::assign<QObject>(&(this->previousLeft).wp,&pQVar2->super_QObject);
      pQVar6 = (QWidget *)(this->m_menuLabel).wp.value;
    }
    QWidget::show(pQVar6);
  }
  pDVar4 = (this->m_controllerWidget).wp.d;
  if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
    object = (QObject *)0x0;
  }
  else {
    object = (this->m_controllerWidget).wp.value;
  }
  pCVar3 = QtPrivate::qobject_cast_helper<QMdi::ControllerWidget*,QObject>(object);
  if ((pCVar3 == (ControllerWidget *)0x0) ||
     (((pCVar3->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
       super_QFlagsStorage<QStyle::SubControl>.i & 7) == 0)) goto LAB_00416462;
  pQVar2 = QMenuBar::cornerWidget(menuBar,TopRightCorner);
  if (pQVar2 == (QWidget *)0x0) {
    pDVar4 = (this->m_controllerWidget).wp.d;
LAB_00416419:
    pQVar6 = (QWidget *)(this->m_controllerWidget).wp.value;
    pQVar5 = (QWidget *)0x0;
    if (*(int *)(pDVar4 + 4) != 0) {
      pQVar5 = pQVar6;
    }
    if (pQVar5 != pQVar2) {
      if (*(int *)(pDVar4 + 4) == 0) {
        pQVar6 = (QWidget *)0x0;
      }
      goto LAB_00416438;
    }
  }
  else {
    QWidget::hide(pQVar2);
    pDVar4 = (this->m_controllerWidget).wp.d;
    if (pDVar4 != (Data *)0x0) goto LAB_00416419;
    pQVar6 = (QWidget *)0x0;
LAB_00416438:
    QMenuBar::setCornerWidget(menuBar,pQVar6,TopRightCorner);
    QWeakPointer<QObject>::assign<QObject>(&(this->previousRight).wp,&pQVar2->super_QObject);
    pQVar6 = (QWidget *)(this->m_controllerWidget).wp.value;
  }
  QWidget::show(pQVar6);
LAB_00416462:
  QMdiSubWindowPrivate::setNewWindowTitle(*(QMdiSubWindowPrivate **)((this->mdiChild).wp.value + 8))
  ;
  return;
}

Assistant:

void ControlContainer::showButtonsInMenuBar(QMenuBar *menuBar)
{
    if (!menuBar || !mdiChild || mdiChild->windowFlags() & Qt::FramelessWindowHint)
        return;
    m_menuBar = menuBar;

    if (m_menuLabel && mdiChild->windowFlags() & Qt::WindowSystemMenuHint) {
        QWidget *currentLeft = menuBar->cornerWidget(Qt::TopLeftCorner);
        if (currentLeft)
            currentLeft->hide();
        if (currentLeft != m_menuLabel) {
            menuBar->setCornerWidget(m_menuLabel, Qt::TopLeftCorner);
            previousLeft = currentLeft;
        }
        m_menuLabel->show();
    }
    ControllerWidget *controllerWidget = qobject_cast<ControllerWidget *>(m_controllerWidget);
    if (controllerWidget && controllerWidget->hasVisibleControls()) {
        QWidget *currentRight = menuBar->cornerWidget(Qt::TopRightCorner);
        if (currentRight)
            currentRight->hide();
        if (currentRight != m_controllerWidget) {
            menuBar->setCornerWidget(m_controllerWidget, Qt::TopRightCorner);
            previousRight = currentRight;
        }
        m_controllerWidget->show();
    }
    mdiChild->d_func()->setNewWindowTitle();
}